

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  GLFWwindow *handle;
  EVP_PKEY_CTX *ctx;
  bool bVar2;
  exception *e;
  GLFWwindow *window;
  int cnt_1;
  int cnt;
  int i;
  char **argv_local;
  int argc_local;
  
  for (cnt_1 = 1; cnt_1 < argc; cnt_1 = cnt_1 + 1) {
    iVar1 = strcmp("--merl",argv[cnt_1]);
    if (iVar1 == 0) {
      cnt_1 = cnt_1 + 1;
      do {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,
                   argv + cnt_1);
        bVar2 = false;
        if (0 < argc - cnt_1) {
          iVar1 = strncmp("-",argv[cnt_1],1);
          bVar2 = iVar1 != 0;
        }
      } while (bVar2);
      fprintf(_stdout,"Note: number of MERL BRDFs set to %i\n",0);
      fflush(_stdout);
    }
    else {
      iVar1 = strcmp("--envmap",argv[cnt_1]);
      if (iVar1 == 0) {
        cnt_1 = cnt_1 + 1;
        do {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&g_sphere.shading.envmap.files,argv + cnt_1);
          cnt_1 = cnt_1 + 1;
          bVar2 = false;
          if (0 < argc - cnt_1) {
            iVar1 = strncmp("-",argv[cnt_1],1);
            bVar2 = iVar1 != 0;
          }
        } while (bVar2);
        fprintf(_stdout,"Note: number of Envmaps set to %i\n",0);
        fflush(_stdout);
      }
      else {
        iVar1 = strcmp("--shader-dir",argv[cnt_1]);
        if (iVar1 == 0) {
          cnt_1 = cnt_1 + 1;
          g_app.dir.shader = argv[cnt_1];
          fprintf(_stdout,"Note: shader dir set to %s\n",g_app.dir.shader);
          fflush(_stdout);
        }
        else {
          iVar1 = strcmp("--npf-data",argv[cnt_1]);
          if (iVar1 == 0) {
            cnt_1 = cnt_1 + 1;
            g_sphere.shading.pathToUberData = argv[cnt_1];
            fprintf(_stdout,"Note: NPF data set to %s\n",g_sphere.shading.pathToUberData);
            fflush(_stdout);
          }
        }
      }
    }
  }
  glfwInit();
  glfwWindowHint(0x22002,4);
  glfwWindowHint(0x22003,5);
  glfwWindowHint(0x22008,0x32001);
  glfwWindowHint(0x22007,1);
  fprintf(_stdout,"Loading {Window-Main}\n");
  fflush(_stdout);
  handle = glfwCreateWindow(0x690,0x41a,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    fprintf(_stdout,"=> Failure <=\n");
    fflush(_stdout);
    glfwTerminate();
    argv_local._4_4_ = -1;
  }
  else {
    glfwMakeContextCurrent(handle);
    glfwSetKeyCallback(handle,keyboardCallback);
    glfwSetCursorPosCallback(handle,mouseMotionCallback);
    glfwSetMouseButtonCallback(handle,mouseButtonCallback);
    glfwSetScrollCallback(handle,mouseScrollCallback);
    fprintf(_stdout,"Loading {OpenGL}\n");
    fflush(_stdout);
    iVar1 = gladLoadGLLoader(glfwGetProcAddress);
    if (iVar1 == 0) {
      fprintf(_stdout,"gladLoadGLLoader failed\n");
      fflush(_stdout);
      argv_local._4_4_ = -1;
    }
    else {
      fprintf(_stdout,"-- Begin -- Demo\n");
      fflush(_stdout);
      ImGui::CreateContext((ImFontAtlas *)0x0);
      ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
      ctx = (EVP_PKEY_CTX *)0x0;
      ImGui::StyleColorsDark((ImGuiStyle *)0x0);
      init(ctx);
      while (iVar1 = glfwWindowShouldClose(handle), iVar1 == 0) {
        glfwPollEvents();
        (*glad_glClearColor)(0.8,0.8,0.8,1.0);
        (*glad_glClear)(0x4000);
        render();
        glfwSwapBuffers(handle);
      }
      release();
      ImGui_ImplGlfwGL3_Shutdown();
      ImGui::DestroyContext((ImGuiContext *)0x0);
      glfwTerminate();
      fprintf(_stdout,"-- End -- Demo\n");
      fflush(_stdout);
      argv_local._4_4_ = 0;
    }
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, const char **argv)
{
    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--merl", argv[i])) {
            int cnt = 0;

            ++i;
            do {
                g_sphere.shading.merl.files.push_back(argv[i]);
            } while ((cnt < argc-i) && strncmp("-", argv[i+cnt], 1));
            LOG("Note: number of MERL BRDFs set to %i\n", cnt);
        } else if (!strcmp("--envmap", argv[i])) {
            int cnt = 0;

            ++i;
            do {
                g_sphere.shading.envmap.files.push_back(argv[i]);
                ++i;
            } while ((cnt < argc-i) && strncmp("-", argv[i], 1));
            LOG("Note: number of Envmaps set to %i\n", cnt);
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = argv[++i];
            LOG("Note: shader dir set to %s\n", g_app.dir.shader);
        } else if (!strcmp("--npf-data", argv[i])) {
            g_sphere.shading.pathToUberData = argv[++i];
            LOG("Note: NPF data set to %s\n", g_sphere.shading.pathToUberData);
        }
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window)) {
            glfwPollEvents();

            glClearColor(0.8, 0.8, 0.8, 1.0);
            glClear(GL_COLOR_BUFFER_BIT);

            render();

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}